

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O1

QHttp2Stream * __thiscall QHttp2Connection::promisedStream(QHttp2Connection *this,QUrl *streamKey)

{
  Node<QUrl,_unsigned_int> *pNVar1;
  uint *puVar2;
  QHttp2Stream *pQVar3;
  long in_FS_OFFSET;
  quint32 id;
  QHash<unsigned_int,_QPointer<QHttp2Stream>_> local_30;
  QHttp2Stream *local_28;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(Data<QHashPrivate::Node<QUrl,_unsigned_int>_> **)(this + 0x1d0) ==
       (Data<QHashPrivate::Node<QUrl,_unsigned_int>_> *)0x0) ||
     (pNVar1 = QHashPrivate::Data<QHashPrivate::Node<QUrl,_unsigned_int>_>::findNode<QUrl>
                         (*(Data<QHashPrivate::Node<QUrl,_unsigned_int>_> **)(this + 0x1d0),
                          streamKey), pNVar1 == (Node<QUrl,_unsigned_int> *)0x0)) {
    puVar2 = (uint *)0x0;
  }
  else {
    puVar2 = &pNVar1->value;
  }
  if (puVar2 == (uint *)0x0) {
    local_1c = 0;
  }
  else {
    local_1c = *puVar2;
  }
  if (local_1c == 0) {
    pQVar3 = (QHttp2Stream *)0x0;
  }
  else {
    QHash<unsigned_int,_QPointer<QHttp2Stream>_>::value(&local_30,(uint *)(this + 0x1c0));
    if ((local_30.d == (Data *)0x0) || (pQVar3 = local_28, *(int *)&(local_30.d)->field_0x4 == 0)) {
      pQVar3 = (QHttp2Stream *)0x0;
    }
    if (local_30.d != (Data *)0x0) {
      LOCK();
      ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i =
           ((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((local_30.d)->ref).atomic._q_value.super___atomic_base<int>._M_i == 0) &&
         (local_30.d != (Data *)0x0)) {
        operator_delete(local_30.d);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return pQVar3;
}

Assistant:

QHttp2Stream *promisedStream(const QUrl &streamKey) const
    {
        if (quint32 id = m_promisedStreams.value(streamKey, 0); id)
            return m_streams.value(id);
        return nullptr;
    }